

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_TimedText.cpp
# Opt level: O2

void ASDCP::TimedText::DescriptorDump(TimedTextDescriptor *TDesc,FILE *stream)

{
  char *pcVar1;
  char *pcVar2;
  _List_node_base *p_Var3;
  undefined1 local_98 [32];
  char buf [64];
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  local_98[8] = true;
  local_98._9_8_ = *(undefined8 *)TDesc->AssetID;
  local_98._17_8_ = *(undefined8 *)(TDesc->AssetID + 8);
  local_98._0_8_ = &PTR__IArchive_00216010;
  fprintf((FILE *)stream,"              EditRate: %u/%u\n",(ulong)(uint)(TDesc->EditRate).Numerator,
          (ulong)(uint)(TDesc->EditRate).Denominator);
  fprintf((FILE *)stream,"     ContainerDuration: %u\n",(ulong)TDesc->ContainerDuration);
  pcVar1 = Kumu::UUID::EncodeHex((UUID *)local_98,buf,0x40);
  fprintf((FILE *)stream,"               AssetID: %s\n",pcVar1);
  fprintf((FILE *)stream,"         NamespaceName: %s\n",(TDesc->NamespaceName)._M_dataplus._M_p);
  fprintf((FILE *)stream,"         ResourceCount: %zu\n",
          (TDesc->ResourceList).
          super__List_base<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
          ._M_impl._M_node._M_size);
  fprintf((FILE *)stream,"RFC5646LanguageTagList: %s\n",
          (TDesc->RFC5646LanguageTagList)._M_dataplus._M_p);
  p_Var3 = (_List_node_base *)&TDesc->ResourceList;
  while (p_Var3 = (((_List_base<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
                     *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)&TDesc->ResourceList) {
    local_98[8] = true;
    local_98._9_8_ = p_Var3[1]._M_next;
    local_98._17_8_ = p_Var3[1]._M_prev;
    pcVar1 = Kumu::UUID::EncodeHex((UUID *)local_98,buf,0x40);
    pcVar2 = "application/x-font-opentype";
    if (*(int *)&p_Var3[2]._M_next != 2) {
      pcVar2 = "application/octet-stream";
    }
    if (*(int *)&p_Var3[2]._M_next == 1) {
      pcVar2 = "image/png";
    }
    fprintf((FILE *)stream,"    %s: %s\n",pcVar1,pcVar2);
  }
  return;
}

Assistant:

void
ASDCP::TimedText::DescriptorDump(ASDCP::TimedText::TimedTextDescriptor const& TDesc, FILE* stream)
{
  if ( stream == 0 )
    stream = stderr;

  UUID TmpID(TDesc.AssetID);
  char buf[64];

  fprintf(stream, "              EditRate: %u/%u\n", TDesc.EditRate.Numerator, TDesc.EditRate.Denominator);
  fprintf(stream, "     ContainerDuration: %u\n",    TDesc.ContainerDuration);
  fprintf(stream, "               AssetID: %s\n",    TmpID.EncodeHex(buf, 64));
  fprintf(stream, "         NamespaceName: %s\n",    TDesc.NamespaceName.c_str());
  fprintf(stream, "         ResourceCount: %zu\n",   TDesc.ResourceList.size());
  fprintf(stream, "RFC5646LanguageTagList: %s\n",    TDesc.RFC5646LanguageTagList.c_str());

  TimedText::ResourceList_t::const_iterator ri;
  for ( ri = TDesc.ResourceList.begin() ; ri != TDesc.ResourceList.end(); ri++ )
    {
      TmpID.Set((*ri).ResourceID);
      fprintf(stream, "    %s: %s\n",
	      TmpID.EncodeHex(buf, 64), 
	      MIME2str((*ri).Type));
    }
}